

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curiosity.cpp
# Opt level: O0

shared_ptr<chrono::curiosity::CuriosityWheel> __thiscall
chrono::curiosity::Curiosity::GetWheel(Curiosity *this,CuriosityWheelID id)

{
  const_reference pvVar1;
  uint in_EDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_00000034;
  shared_ptr<chrono::curiosity::CuriosityWheel> sVar2;
  CuriosityWheelID id_local;
  Curiosity *this_local;
  
  pvVar1 = std::array<std::shared_ptr<chrono::curiosity::CuriosityWheel>,_6UL>::operator[]
                     ((array<std::shared_ptr<chrono::curiosity::CuriosityWheel>,_6UL> *)
                      (CONCAT44(in_register_00000034,id) + 0x20),(ulong)in_EDX);
  std::shared_ptr<chrono::curiosity::CuriosityWheel>::shared_ptr
            ((shared_ptr<chrono::curiosity::CuriosityWheel> *)this,pvVar1);
  sVar2.super___shared_ptr<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar2.super___shared_ptr<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<chrono::curiosity::CuriosityWheel>)
         sVar2.super___shared_ptr<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<CuriosityWheel> Curiosity::GetWheel(CuriosityWheelID id) const {
    return m_wheels[id];
}